

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O1

bool __thiscall
SMC::grow_one_with_sc
          (SMC *this,Structure *CurConf,int Position,int tmpEnd,int LoopChosen,Atom *EndPt)

{
  double *pdVar1;
  short sVar2;
  uint uVar3;
  Atom *pAVar4;
  Residue *pRVar5;
  Atom *pAVar6;
  bool bVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ostream *poVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  void *pvVar15;
  undefined1 auVar16 [8];
  double (*__s) [6];
  int iVar17;
  int iVar18;
  Residue *pRVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  pointer *ppdVar23;
  double (*padVar24) [6];
  void *__s_00;
  Residue *pRVar25;
  uint uVar26;
  Residue *pRVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  pointer pdVar36;
  double dVar37;
  double dVar38;
  undefined1 auStack_1c78 [248];
  double adStack_1b80 [2];
  Point PStack_1b70;
  Point PStack_1b58;
  Point PStack_1b40;
  undefined1 local_1b28 [8];
  vector<double,_std::allocator<double>_> prob;
  value_type_conflict3 local_c28;
  int Phi [160];
  int Psi [160];
  int deadlabel [160];
  int TorProb [160];
  Residue sam;
  void *local_40;
  
  uVar3 = this->num_dist_states;
  uVar29 = (ulong)uVar3;
  sVar2 = CurConf->_res[Position]._type;
  lVar11 = -(uVar29 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar31 = lVar11 + -0x1b28;
  pAVar4 = CurConf->_res[Position]._atom;
  dVar37 = pAVar4[1].super_Point.x - (EndPt->super_Point).x;
  dVar32 = pAVar4[1].super_Point.y - (EndPt->super_Point).y;
  dVar33 = pAVar4[1].super_Point.z - (EndPt->super_Point).z;
  dVar32 = dVar33 * dVar33 + dVar37 * dVar37 + dVar32 * dVar32;
  if (dVar32 < 0.0) {
    *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x12372d;
    dVar32 = sqrt(dVar32);
  }
  else {
    dVar32 = SQRT(dVar32);
  }
  uVar26 = tmpEnd - Position;
  dVar33 = this->minDistcon[1][(int)uVar26];
  if ((dVar33 <= dVar32) && (dVar32 <= this->DistconBy[1][(int)uVar26] * 31.0 + dVar33)) {
    dVar33 = *(double *)((long)(this->minDistcon + -1) + ((long)(int)uVar26 + 0x13) * 8);
    dVar37 = this->DistconBy[-1][(long)(int)uVar26 + 0x13];
    lVar22 = 0;
    *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x1237cb;
    memset(Psi + 0x9e,0,0x280);
    ppdVar23 = &prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    iVar10 = 0;
    do {
      *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x12380d;
      Residue::Residue((Residue *)(TorProb + 0x9e),0x1e);
      deadlabel[lVar22 + 0x9e] = -1;
      pAVar4 = CurConf->_res[Position]._atom;
      dVar35 = Residue::bond_angle[sVar2][2];
      dVar34 = Residue::bond_length[sVar2][2];
      *(ulong *)(local_1b28 + lVar11 + -0x10) = (ulong)uVar26;
      *(undefined8 *)((long)&PStack_1b40 + lVar11) = 0x12386c;
      sample_distance(this,pAVar4,pAVar4 + 1,EndPt,dVar35,dVar34,(Atom *)(TorProb._632_8_ + 0xa0),
                      dVar32,1,*(int *)(local_1b28 + lVar11 + -0x10));
      if ((ulong)ABS(*(double *)(TorProb._632_8_ + 0xa0)) < 0x7ff0000000000000) {
        dVar38 = *(double *)(TorProb._632_8_ + 0xa0) - (EndPt->super_Point).x;
        dVar35 = *(double *)(TorProb._632_8_ + 0xa8) - (EndPt->super_Point).y;
        dVar34 = *(double *)(TorProb._632_8_ + 0xb0) - (EndPt->super_Point).z;
        dVar35 = dVar34 * dVar34 + dVar38 * dVar38 + dVar35 * dVar35;
        if (dVar35 < 0.0) {
          *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123918;
          dVar35 = sqrt(dVar35);
        }
        else {
          dVar35 = SQRT(dVar35);
        }
        if ((dVar35 < dVar33) || (dVar37 * 31.0 + dVar33 < dVar35)) {
LAB_00123b0e:
          deadlabel[lVar22 + 0x9e] = 0;
          Psi[lVar22 + 0x9e] = 1;
          iVar10 = iVar10 + 1;
        }
        else {
          pAVar4 = CurConf->_res[Position]._atom;
          dVar34 = Residue::bond_angle[sVar2][0];
          dVar38 = Residue::bond_length[sVar2][0];
          *(ulong *)(local_1b28 + lVar11 + -0x10) = (ulong)(uVar26 - 1);
          *(undefined8 *)((long)&PStack_1b40 + lVar11) = 0x123984;
          sample_distance(this,pAVar4 + 1,(Atom *)(TorProb._632_8_ + 0xa0),EndPt,dVar34,dVar38,
                          (Atom *)TorProb._632_8_,dVar35,0,*(int *)(local_1b28 + lVar11 + -0x10));
          if (0x7fefffffffffffff < (*(ulong *)TorProb._632_8_ & 0x7fffffffffffffff)) {
            deadlabel[lVar22 + 0x9e] = 0;
            Psi[lVar22 + 0x9e] = 1;
            goto LAB_001238c2;
          }
          pAVar4 = CurConf->_res[(long)Position + -1]._atom;
          pAVar6 = CurConf->_res[Position]._atom;
          *(undefined8 *)(local_1b28 + lVar11 + -8) = *(undefined8 *)(TorProb._632_8_ + 0xb0);
          uVar8 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
          *(undefined8 *)((long)&PStack_1b40 + lVar11) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
          *(undefined8 *)(local_1b28 + lVar11 + -0x10) = uVar8;
          *(double *)((long)&PStack_1b58 + lVar11 + 0x10) = pAVar6[1].super_Point.z;
          dVar35 = pAVar6[1].super_Point.y;
          *(double *)((long)&PStack_1b58 + lVar11) = pAVar6[1].super_Point.x;
          *(double *)((long)&PStack_1b58 + lVar11 + 8) = dVar35;
          *(double *)((long)&PStack_1b70 + lVar11 + 0x10) = (pAVar6->super_Point).z;
          dVar35 = (pAVar6->super_Point).y;
          *(double *)((long)&PStack_1b70 + lVar11) = (pAVar6->super_Point).x;
          *(double *)((long)&PStack_1b70 + lVar11 + 8) = dVar35;
          *(double *)((long)adStack_1b80 + lVar11 + 8) = pAVar4[2].super_Point.z;
          dVar35 = pAVar4[2].super_Point.y;
          *(double *)(auStack_1c78 + lVar11 + 0xf0) = pAVar4[2].super_Point.x;
          *(double *)((long)adStack_1b80 + lVar11) = dVar35;
          *(undefined8 *)(auStack_1c78 + lVar11 + 0xe8) = 0x123a51;
          dVar35 = torsion(*(Point *)(auStack_1c78 + lVar11 + 0xf0),
                           *(Point *)((long)&PStack_1b70 + lVar11),
                           *(Point *)((long)&PStack_1b58 + lVar11),
                           *(Point *)((long)&PStack_1b40 + lVar11),torsion_degrees);
          ppdVar23[-2] = (pointer)dVar35;
          pAVar4 = CurConf->_res[Position]._atom;
          *(undefined8 *)(local_1b28 + lVar11 + -8) = *(undefined8 *)(TorProb._632_8_ + 0x10);
          uVar8 = *(undefined8 *)(TorProb._632_8_ + 8);
          *(undefined8 *)((long)&PStack_1b40 + lVar11) = *(undefined8 *)TorProb._632_8_;
          *(undefined8 *)(local_1b28 + lVar11 + -0x10) = uVar8;
          *(undefined8 *)((long)&PStack_1b58 + lVar11 + 0x10) =
               *(undefined8 *)(TorProb._632_8_ + 0xb0);
          uVar8 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
          *(undefined8 *)((long)&PStack_1b58 + lVar11) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
          *(undefined8 *)((long)&PStack_1b58 + lVar11 + 8) = uVar8;
          *(double *)((long)&PStack_1b70 + lVar11 + 0x10) = pAVar4[1].super_Point.z;
          dVar35 = pAVar4[1].super_Point.y;
          *(double *)((long)&PStack_1b70 + lVar11) = pAVar4[1].super_Point.x;
          *(double *)((long)&PStack_1b70 + lVar11 + 8) = dVar35;
          *(double *)((long)adStack_1b80 + lVar11 + 8) = (pAVar4->super_Point).z;
          dVar35 = (pAVar4->super_Point).y;
          *(double *)(auStack_1c78 + lVar11 + 0xf0) = (pAVar4->super_Point).x;
          *(double *)((long)adStack_1b80 + lVar11) = dVar35;
          *(undefined8 *)(auStack_1c78 + lVar11 + 0xe8) = 0x123aca;
          pdVar36 = (pointer)torsion(*(Point *)(auStack_1c78 + lVar11 + 0xf0),
                                     *(Point *)((long)&PStack_1b70 + lVar11),
                                     *(Point *)((long)&PStack_1b58 + lVar11),
                                     *(Point *)((long)&PStack_1b40 + lVar11),torsion_degrees);
          ((_Vector_impl_data *)(ppdVar23 + -1))->_M_start = pdVar36;
          *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123aec;
          box_MullerNsample_single((double *)ppdVar23,3.14159265358979,0.06981317007977311);
          if (0x7fefffffffffffff < ((ulong)*ppdVar23 & 0x7fffffffffffffff)) goto LAB_00123b0e;
        }
      }
      else {
        deadlabel[lVar22 + 0x9e] = 0;
        Psi[lVar22 + 0x9e] = 1;
LAB_001238c2:
        iVar10 = iVar10 + 1;
      }
      *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123b2e;
      Residue::~Residue((Residue *)(TorProb + 0x9e));
      lVar22 = lVar22 + 1;
      ppdVar23 = ppdVar23 + 3;
    } while (lVar22 != 0xa0);
    if (iVar10 != 0xa0) {
      lVar22 = 0;
      pvVar14 = &prob;
      iVar17 = 0;
      do {
        if (deadlabel[lVar22 + 0x9e] == -1) {
          dVar33 = (double)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage / 5.0;
          iVar18 = (int)dVar33;
          iVar9 = iVar18 + 0x24;
          dVar32 = (double)(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start / 5.0;
          iVar20 = (int)dVar32;
          iVar18 = iVar18 + 0x23;
          if ((double)iVar9 <= dVar33 + 36.0) {
            iVar18 = iVar9;
          }
          iVar9 = iVar20 + 0x24;
          iVar20 = iVar20 + 0x23;
          if ((double)iVar9 <= dVar32 + 36.0) {
            iVar20 = iVar9;
          }
          Phi[lVar22 + -2] = iVar18;
          Phi[lVar22 + 0x9e] = iVar20;
          iVar9 = this->Joint_Angle[sVar2][iVar18][iVar20];
          deadlabel[lVar22 + 0x9e] = iVar9;
          iVar17 = iVar17 + iVar9;
        }
        lVar22 = lVar22 + 1;
        pvVar14 = pvVar14 + 1;
      } while (lVar22 != 0xa0);
      if ((iVar17 == 0) || (this->use_rot_lib != true)) {
        if (0 < (int)uVar3) {
          uVar30 = 0;
          do {
            *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123da8;
            iVar17 = rand();
            do {
              lVar22 = (long)(iVar17 % 0xa0);
              iVar17 = iVar17 + 1 + (iVar17 / 0xa0) * -0xa0;
            } while (Psi[lVar22 + 0x9e] == 1);
            *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123de1;
            iVar17 = rand();
            dVar32 = ((double)(Phi[lVar22 + -2] + -0x24) * 3.14159265358979) / 36.0;
            *(double *)(local_1b28 + uVar30 * 0x18 + lVar31 + 0x1b28) =
                 (((double)(Phi[lVar22 + -2] + -0x23) * 3.14159265358979) / 36.0 - dVar32) *
                 (((double)iVar17 + 0.5) / 2147483647.0) + dVar32;
            *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123e58;
            iVar17 = rand();
            dVar32 = ((double)(Phi[lVar22 + 0x9e] + -0x24) * 3.14159265358979) / 36.0;
            *(double *)((long)&prob + uVar30 * 0x18 + lVar11) =
                 (((double)(Phi[lVar22 + 0x9e] + -0x23) * 3.14159265358979) / 36.0 - dVar32) *
                 (((double)iVar17 + 0.5) / 2147483647.0) + dVar32;
            *(pointer *)((long)&prob + uVar30 * 0x18 + lVar11 + 8) =
                 (&prob)[lVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar29);
        }
      }
      else if (0 < (int)uVar3) {
        uVar30 = 0;
        do {
          ppdVar23 = &prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123c51;
          iVar9 = rand();
          lVar22 = 0;
          iVar18 = 0;
          do {
            iVar18 = iVar18 + deadlabel[lVar22 + 0x9e];
            if (iVar9 % iVar17 < iVar18) {
              *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123c82;
              iVar9 = rand();
              dVar32 = ((double)(Phi[lVar22 + -2] + -0x24) * 3.14159265358979) / 36.0;
              *(double *)(local_1b28 + uVar30 * 0x18 + lVar31 + 0x1b28) =
                   (((double)(Phi[lVar22 + -2] + -0x23) * 3.14159265358979) / 36.0 - dVar32) *
                   (((double)iVar9 + 0.5) / 2147483647.0) + dVar32;
              *(undefined8 *)(local_1b28 + lVar11 + -8) = 0x123cff;
              iVar9 = rand();
              dVar32 = ((double)(Phi[lVar22 + 0x9e] + -0x24) * 3.14159265358979) / 36.0;
              *(double *)((long)&prob + uVar30 * 0x18 + lVar11) =
                   (((double)(Phi[lVar22 + 0x9e] + -0x23) * 3.14159265358979) / 36.0 - dVar32) *
                   (((double)iVar9 + 0.5) / 2147483647.0) + dVar32;
              *(pointer *)((long)&prob + uVar30 * 0x18 + lVar11 + 8) = *ppdVar23;
              break;
            }
            lVar22 = lVar22 + 1;
            ppdVar23 = ppdVar23 + 3;
          } while (lVar22 != 0xa0);
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar29);
      }
      if (iVar10 != 0xa0) {
        uVar26 = this->num_sc_states;
        uVar28 = (ulong)uVar26;
        __s = (double (*) [6])(local_1b28 + uVar28 * uVar29 * -0x30 + lVar31 + 0x1b28);
        __s[-1][5] = 5.90823461922796e-318;
        memset(__s,0,(long)(int)(uVar26 * uVar3 * 6) << 3);
        padVar24 = __s;
        uVar30 = uVar29;
        if (0 < (int)uVar3) {
          do {
            pRVar27 = CurConf->_res;
            iVar10 = this->num_sc_states;
            iVar17 = this->ang_type;
            __s[-1][5] = 5.90856070255422e-318;
            sample_sc_angles(pRVar27 + Position,padVar24,iVar10,iVar17);
            uVar30 = uVar30 - 1;
            padVar24 = padVar24 + uVar28;
          } while (uVar30 != 0);
        }
        uVar30 = (ulong)(uint)this->num_sc_states;
        lVar11 = uVar30 * uVar29;
        pRVar27 = (Residue *)(__s + lVar11 * -7);
        if (lVar11 != 0) {
          lVar22 = 0;
          do {
            pRVar27[-1]._center._posn = 0x123fca;
            pRVar27[-1]._center._state = 0;
            *(undefined2 *)&pRVar27[-1]._center.field_0x4e = 0;
            Residue::Residue((Residue *)((long)pRVar27->_scChi + lVar22 + -0x28),0x1e);
            lVar22 = lVar22 + 0x150;
          } while (lVar11 * 0x150 - lVar22 != 0);
        }
        uVar26 = this->num_sc_states;
        uVar21 = (ulong)uVar26;
        __s_00 = (void *)((long)pRVar27 - (uVar21 * uVar29 * 8 + 0xf & 0xfffffffffffffff0));
        *(undefined8 *)((long)__s_00 + -8) = 0x124023;
        memset(__s_00,0,(long)(int)(uVar26 * uVar3) << 3);
        if ((int)uVar3 < 1) {
          dVar32 = 1.79769313486232e+308;
        }
        else {
          dVar32 = 1.79769313486232e+308;
          uVar12 = 0;
          pRVar19 = pRVar27;
          local_40 = __s_00;
          do {
            if (0 < this->num_sc_states) {
              pdVar1 = (double *)(local_1b28 + uVar12 * 0x18 + lVar31 + 0x1b28);
              lVar22 = 0;
              padVar24 = __s;
              pRVar25 = pRVar19;
              dVar33 = dVar32;
              do {
                pRVar5 = CurConf->_res;
                *(undefined8 *)((long)__s_00 + -8) = 0x1240e2;
                Residue::operator=(pRVar25,pRVar5 + Position);
                dVar32 = *pdVar1;
                pRVar25->_phi = dVar32;
                dVar37 = pdVar1[1];
                pRVar25->_psi = dVar37;
                dVar35 = pdVar1[2];
                pRVar25->_omega = dVar35;
                *(undefined8 *)((long)__s_00 + -8) = 0x124113;
                Structure::calBBCo(CurConf,Position,pRVar25,dVar32,dVar37,dVar35);
                *(undefined8 *)((long)__s_00 + -8) = 0x124121;
                Structure::calSCCo(CurConf,*padVar24,pRVar25);
                *(undefined8 *)((long)__s_00 + -8) = 0x12412e;
                Structure::SinglecalCenter(CurConf,pRVar25,0);
                *(undefined8 *)((long)__s_00 + -8) = 0x124140;
                dVar32 = one_res_en_loodis_all_list(CurConf,pRVar25,&this->Reslist);
                *(double *)((long)local_40 + lVar22 * 8) = dVar32;
                if (dVar33 <= dVar32) {
                  dVar32 = dVar33;
                }
                lVar22 = lVar22 + 1;
                padVar24 = padVar24 + 1;
                pRVar25 = pRVar25 + 1;
                dVar33 = dVar32;
              } while (lVar22 < this->num_sc_states);
            }
            uVar12 = uVar12 + 1;
            local_40 = (void *)((long)local_40 + uVar21 * 8);
            __s = __s + uVar28;
            pRVar19 = pRVar19 + uVar30;
          } while (uVar12 != uVar29);
        }
        iVar10 = this->num_sc_states;
        local_c28 = 0.0;
        *(undefined8 *)((long)__s_00 + -8) = 0x1241f9;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_1b28,
                   (long)(int)uVar3 * (long)iVar10,&local_c28,(allocator_type *)(Phi + 0x9e));
        if ((int)uVar3 < 1) {
          bVar7 = true;
        }
        else {
          dVar33 = 0.0;
          uVar28 = 0;
          pvVar15 = __s_00;
          do {
            uVar12 = (ulong)(uint)this->num_sc_states;
            if (0 < this->num_sc_states) {
              lVar31 = 0;
              do {
                dVar37 = *(double *)((long)pvVar15 + lVar31 * 8);
                *(undefined8 *)((long)__s_00 + -8) = 0x12425e;
                dVar37 = pow(2.718281828,(dVar32 - dVar37) * 0.5);
                *(double *)((long)local_1b28 + ((int)uVar12 * (int)uVar28 + lVar31) * 8) = dVar37;
                if (0x7fefffffffffffff < (ulong)ABS(dVar37)) {
                  *(undefined8 *)((long)__s_00 + -8) = 0x1246cc;
                  __assert_fail("std::isfinite(prob[k])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                                ,0x30d,
                                "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                               );
                }
                dVar33 = dVar33 + dVar37;
                if (0x7fefffffffffffff < (long)ABS(dVar33)) {
                  *(undefined8 *)((long)__s_00 + -8) = 0x1246eb;
                  __assert_fail("std::isfinite(sum)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                                ,0x314,
                                "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                               );
                }
                lVar31 = lVar31 + 1;
                uVar12 = (ulong)this->num_sc_states;
              } while (lVar31 < (long)uVar12);
            }
            uVar28 = uVar28 + 1;
            pvVar15 = (void *)((long)pvVar15 + uVar21 * 8);
          } while (uVar28 != uVar29);
          bVar7 = dVar33 <= 1e-10;
        }
        if ((bool)(0 < (int)uVar3 & bVar7)) {
          uVar3 = this->num_sc_states;
          uVar28 = 0;
          auVar16 = local_1b28;
          do {
            if (0 < (int)uVar3) {
              uVar21 = 0;
              do {
                *(double *)((long)auVar16 + uVar21 * 8) = 1.0;
                uVar21 = uVar21 + 1;
              } while (uVar3 != uVar21);
            }
            uVar28 = uVar28 + 1;
            auVar16 = (undefined1  [8])((long)auVar16 + (ulong)uVar3 * 8);
          } while (uVar28 != uVar29);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x124356;
        iVar10 = SampleOne((vector<double,_std::allocator<double>_> *)local_1b28);
        pRVar19 = CurConf->_res;
        if ((pRVar19[Position]._type == -1) || (pRVar19[Position]._type == -0x3039)) {
          *(undefined8 *)((long)__s_00 + -8) = 0x124703;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"grow_one_bb_only atom type error ",0x21);
          *(undefined8 *)((long)__s_00 + -8) = 0x124712;
          poVar13 = (ostream *)std::ostream::operator<<(&std::cout,Position);
          *(undefined8 *)((long)__s_00 + -8) = 0x12471a;
          std::endl<char,std::char_traits<char>>(poVar13);
          *(undefined8 *)((long)__s_00 + -8) = 0x124721;
          exit(0);
        }
        pAVar4 = pRVar19[Position]._atom;
        dVar32 = (pAVar4->super_Point).x;
        if ((((dVar32 == 0.0) && (!NAN(dVar32))) &&
            (dVar32 = (pAVar4->super_Point).y, dVar32 == 0.0)) &&
           (((!NAN(dVar32) && (dVar32 = (pAVar4->super_Point).z, dVar32 == 0.0)) && (!NAN(dVar32))))
           ) {
          *(undefined8 *)((long)__s_00 + -8) = 0x124740;
          __assert_fail("!CurConf._res[Position]._atom[ATM_N].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x331,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        dVar32 = pAVar4[1].super_Point.x;
        if (((dVar32 == 0.0) && (!NAN(dVar32))) &&
           ((dVar32 = pAVar4[1].super_Point.y, dVar32 == 0.0 &&
            (((!NAN(dVar32) && (dVar32 = pAVar4[1].super_Point.z, dVar32 == 0.0)) && (!NAN(dVar32)))
            )))) {
          *(undefined8 *)((long)__s_00 + -8) = 0x12475f;
          __assert_fail("!CurConf._res[Position]._atom[ATM_CA].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x332,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        dVar32 = pAVar4[2].super_Point.x;
        if (((dVar32 != 0.0) || (NAN(dVar32))) ||
           (((dVar32 = pAVar4[2].super_Point.y, dVar32 != 0.0 ||
             ((NAN(dVar32) || (dVar32 = pAVar4[2].super_Point.z, dVar32 != 0.0)))) || (NAN(dVar32)))
           )) {
          *(undefined8 *)((long)__s_00 + -8) = 0x12477e;
          __assert_fail("CurConf._res[Position]._atom[ATM_C].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x333,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        dVar32 = pAVar4[3].super_Point.x;
        if (((((dVar32 != 0.0) || (NAN(dVar32))) ||
             (dVar32 = pAVar4[3].super_Point.y, dVar32 != 0.0)) ||
            ((NAN(dVar32) || (dVar32 = pAVar4[3].super_Point.z, dVar32 != 0.0)))) || (NAN(dVar32)))
        {
          *(undefined8 *)((long)__s_00 + -8) = 0x12479d;
          __assert_fail("CurConf._res[Position]._atom[ATM_O].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x334,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        iVar17 = Position + 1;
        pAVar6 = pRVar19[iVar17]._atom;
        dVar32 = (pAVar6->super_Point).x;
        if (((dVar32 != 0.0) || (NAN(dVar32))) ||
           ((dVar32 = (pAVar6->super_Point).y, dVar32 != 0.0 ||
            (((NAN(dVar32) || (dVar32 = (pAVar6->super_Point).z, dVar32 != 0.0)) || (NAN(dVar32)))))
           )) {
          *(undefined8 *)((long)__s_00 + -8) = 0x1247bc;
          __assert_fail("CurConf._res[Position + 1]._atom[ATM_N].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x335,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        dVar32 = pAVar6[1].super_Point.x;
        if ((((dVar32 != 0.0) || (NAN(dVar32))) ||
            ((dVar32 = pAVar6[1].super_Point.y, dVar32 != 0.0 ||
             ((NAN(dVar32) || (dVar32 = pAVar6[1].super_Point.z, dVar32 != 0.0)))))) ||
           (NAN(dVar32))) {
          *(undefined8 *)((long)__s_00 + -8) = 0x1247db;
          __assert_fail("CurConf._res[Position + 1]._atom[ATM_CA].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x336,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        pRVar19 = pRVar27 + (long)(iVar10 % this->num_sc_states) +
                            (long)(iVar10 / this->num_sc_states) * uVar30;
        pAVar6 = pRVar19->_atom;
        *(undefined8 *)((long)__s_00 + -8) = 0x12453c;
        Atom::CopyPos(pAVar4 + 2,pAVar6 + 2);
        pAVar4 = CurConf->_res[Position]._atom;
        pAVar6 = pRVar19->_atom;
        *(undefined8 *)((long)__s_00 + -8) = 0x124554;
        Atom::CopyPos(pAVar4 + 3,pAVar6 + 3);
        pAVar4 = CurConf->_res[iVar17]._atom;
        pAVar6 = pRVar19->_atom;
        *(undefined8 *)((long)__s_00 + -8) = 0x124564;
        Atom::CopyPos(pAVar4,pAVar6);
        pAVar4 = CurConf->_res[iVar17]._atom;
        pAVar6 = pRVar19->_atom;
        *(undefined8 *)((long)__s_00 + -8) = 0x12457c;
        Atom::CopyPos(pAVar4 + 1,pAVar6 + 1);
        if (CurConf->_res[Position]._type != 5) {
          pAVar4 = CurConf->_res[Position]._atom;
          dVar32 = pAVar4[5].super_Point.x;
          if ((((dVar32 != 0.0) || (NAN(dVar32))) ||
              (dVar32 = pAVar4[5].super_Point.y, dVar32 != 0.0)) ||
             (((NAN(dVar32) || (dVar32 = pAVar4[5].super_Point.z, dVar32 != 0.0)) || (NAN(dVar32))))
             ) {
            *(undefined8 *)((long)__s_00 + -8) = 0x1247fa;
            __assert_fail("CurConf._res[Position]._atom[ATM_CB].is_at_origin()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x347,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
          pAVar6 = pRVar19->_atom;
          *(undefined8 *)((long)__s_00 + -8) = 0x1245f6;
          Atom::CopyPos(pAVar4 + 5,pAVar6 + 5);
          if (pRVar19->_numAtom != CurConf->_res[Position]._numAtom) {
            *(undefined1 **)((long)__s_00 + -8) = &LAB_00124819;
            __assert_fail("chosen_res._numAtom == CurConf._res[Position]._numAtom",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x34b,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
          pRVar25 = CurConf->_res;
          if (6 < pRVar25[Position]._numAtom) {
            lVar22 = 6;
            lVar31 = 0x1e0;
            do {
              pAVar4 = pRVar25[Position]._atom;
              pAVar6 = pRVar19->_atom;
              *(undefined8 *)((long)__s_00 + -8) = 0x124636;
              Atom::CopyPos((Atom *)((long)&(pAVar4->super_Point).x + lVar31),
                            (Atom *)((long)&(pAVar6->super_Point).x + lVar31));
              lVar22 = lVar22 + 1;
              pRVar25 = CurConf->_res;
              lVar31 = lVar31 + 0x50;
            } while (lVar22 < pRVar25[Position]._numAtom);
          }
        }
        pRVar19 = CurConf->_res;
        *(undefined8 *)((long)__s_00 + -8) = 0x124660;
        Structure::SinglecalCenter(CurConf,pRVar19 + Position,0);
        if (local_1b28 != (undefined1  [8])0x0) {
          *(undefined8 *)((long)__s_00 + -8) = 0x124671;
          operator_delete((void *)local_1b28);
        }
        if (lVar11 != 0) {
          lVar11 = lVar11 * 0x150;
          do {
            *(undefined8 *)((long)__s_00 + -8) = 0x12469f;
            Residue::~Residue((Residue *)((long)pRVar27[-1]._scChi + lVar11 + -0x28));
            lVar11 = lVar11 + -0x150;
          } while (lVar11 != 0);
          return true;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SMC::grow_one_with_sc(Structure &CurConf, const int Position, const int tmpEnd, const int LoopChosen,
                           const Atom &EndPt) {

    // Initialize positional values
    int phi_int, psi_int;

    // Initialize numbers of backbone states
    const int NumBBStates = this->num_dist_states;

    // The current residue
    const int CurResType = CurConf._res[Position]._type;

    // Placeholders for sampling
    DECLARE_VLA_2D(double, bb_angles, NumBBStates, 3);

    const int binNum = 180 / BBTbinSize;
    const double EEdisC = CurConf._res[Position]._atom[ATM_CA].dis(EndPt);
    double EEdisN = 0;

    const int RemLength = tmpEnd - Position;
    const double minEEDisC = minDistcon[1][RemLength];
    const double maxEEDisC = minDistcon[1][RemLength] + 31 * DistconBy[1][RemLength];
    const double minEEDisN = minDistcon[0][RemLength - 1];
    const double maxEEDisN = minDistcon[0][RemLength - 1] + 31 * DistconBy[0][RemLength - 1];
    
    int num_dead_labels = 0;

    /////////////////////////////////////////////////////////////////
    // Sample end-to-end distances and convert to positions.
    // End-to-end distances are sampled from an empirical distribution
    /////////////////////////////////////////////////////////////////

    // Early out if distance constraints are not satisfied
    // for carbon atom
    if (EEdisC < minEEDisC || EEdisC > maxEEDisC) {
        return false;
    }

    // BEGIN LargeNumDistanceStates scope
    {
        const int LargeNumDistanceStates = 160;
        DECLARE_VLA_2D(double, larbb_angles, LargeNumDistanceStates, 3);

        DECLARE_VLA_1D(int, Phi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, Psi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, TorProb, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, deadlabel, LargeNumDistanceStates);

        SET_VLA_1D(int, deadlabel, LargeNumDistanceStates, 0);

        // Loop through states
        for (int i = 0; i < LargeNumDistanceStates; i++) {
            // Initialize four residues for this sample
            Residue sam;
            // Sample new points for C atom based on distance to final C
            TorProb[i] = -1;

            // Sample carbon atom
            sample_distance(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            EndPt,
                            Residue::bond_angle[CurResType][ATM_C],
                            Residue::bond_length[CurResType][ATM_C],
                            sam._atom[ATM_C], EEdisC,
                            1, RemLength);

            // Skip if sampling failed (and try again)
            if (conditional_mark_dead_label(sam._atom[ATM_C].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Sample new points for N atom based on distance to final C
            EEdisN = sam._atom[ATM_C].dis(EndPt);
            if (EEdisN >= minEEDisN && EEdisN <= maxEEDisN) {
                sample_distance(CurConf._res[Position]._atom[ATM_CA],
                                sam._atom[ATM_C],
                                EndPt,
                                Residue::bond_angle[CurResType][ATM_N],
                                Residue::bond_length[CurResType][ATM_N],
                                sam._atom[ATM_N], EEdisN,
                                // -1 since it's NEXT N
                                0, RemLength - 1);
            }
            else {
                TorProb[i] = 0;
                deadlabel[i] = 1;
                ++num_dead_labels;
                continue;
            }

            if (conditional_mark_dead_label(sam._atom[ATM_N].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Populate remainder of bb_angles with the torsion angles
            // implied by the positional selections for C and N. This is for
            // unity with the existing code base. Omega = pi by default.
            // Note: PI/180 converts from degrees to radians
            larbb_angles[i][eix_phi] =
                    torsion(CurConf._res[Position - 1]._atom[ATM_C],
                            CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C], torsion_degrees);
            larbb_angles[i][eix_psi] =
                    torsion(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C],
                            sam._atom[ATM_N], torsion_degrees);
            // Sample omega (peptide bond) angle from normal distribution
            box_MullerNsample_single(larbb_angles[i][eix_omega], PI, TO_RAD(4));

            // Box muller can return NaN because frand(0,1) can return value > 1 which
            // causes a negative log. This is due to weird FRAND padding with +0.5.
            // The fix is to use the <random> library which handles interval sampling properly.
            conditional_mark_dead_label(larbb_angles[i][eix_omega], TorProb[i], deadlabel[i], num_dead_labels);
        }

        // need to check if all are dead as could infinite loop forever
        if (num_dead_labels == LargeNumDistanceStates) {
            return false;
        }

        /////////////////////////////////////////////////////////////////
        // Of the candidates sampled from end-to-end distance distribution,
        //  select a subset of the generated candidates according to empirical
        //  phi, psi distribution.
        /////////////////////////////////////////////////////////////////

        // Typically, we now have LargeNumDistanceStates # of candidates
        // which have phi, psi torsion angles as determined by sampling
        // from empirical distance distribution. The next step is to select
        // a subset of the candidates (specifically a subset of size
        // NumStates) according to the empirical joint distribution of
        // phi, psi angles for the current residue being grown.
        {
            // @TODO - factor this out into a function, it's a bit
            // tricky because of the VLA arrays, but the best candidate
            // refactoring would be Method-to-Class where local variables
            // become the class variables

            int Total = 0;
            // This loop tallies up how many instances of the discretized
            // (phi, psi) pair have been observed. "TorProb" is actually a
            // misnomer (but effectively functions the same way when combined
            // with "Total" variable) as it is actually an observation count
            // and not a normalized probability.
            for (int i = 0; i < LargeNumDistanceStates; ++i) {

                if (TorProb[i] == -1) {
                    phi_int = (int)(larbb_angles[i][eix_phi] / BBTbinSize) + binNum;
                    psi_int = (int)(larbb_angles[i][eix_psi] / BBTbinSize) + binNum;

                    if (larbb_angles[i][eix_phi] / BBTbinSize + binNum - phi_int < 0)
                        --phi_int;
                    if (larbb_angles[i][eix_psi] / BBTbinSize + binNum - psi_int < 0)
                        --psi_int;
                    Phi[i] = phi_int;
                    Psi[i] = psi_int;

                    TorProb[i] = Joint_Angle[CurResType][phi_int][psi_int];
                    Total += TorProb[i];
                }
            }

            // Check if rotamer library usage has been enabled. The phi, psi
            // backbone libraries are histograms with observed phi, psi counts
            // for a training set of several thousand (~10k) loop samples.
            // However, the histograms have not been smoothed and therefore are
            // somewhat sparse and can make it hard to generate clash free loops.
            // In practice, using the rotamer libraries may lead to loop samples
            // with better RMSD to target structures - but with a cost of potentially
            // higher Lennard Jones potential energy.

            // Now actually select a smaller subset of candidates based on empirical
            // (phi, psi) distribution:
            if ((0 == Total) || !use_rot_lib) {
                for (int i = 0; i < NumBBStates; ++i) {
                    // @TODO - use actual uniform distribution
                    int r = rand() % LargeNumDistanceStates;
                    // Skip to next valid sampled state
                    while (1 == deadlabel[r])
                        r = ((r + 1) % LargeNumDistanceStates);

                    bb_angles[i][eix_phi] = frand((double)((Phi[r] - binNum) * PI / binNum),
                        (double)((Phi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_psi] = frand((double)((Psi[r] - binNum) * PI / binNum),
                        (double)((Psi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_omega] = larbb_angles[r][eix_omega];
                    continue;
                }
            }
            else {
                for (int i = 0; i < NumBBStates; ++i) {
                    // Select a random bin
                    int r = rand() % Total;
                    int cur = 0;
                    for (int j = 0; j < LargeNumDistanceStates; j++) {
                        cur += TorProb[j];
                        if (r < cur) {
                            // Select a random set of torsion angles within selected bin
                            bb_angles[i][eix_phi] = frand((double) ((Phi[j] - binNum) * PI / binNum),
                                                    (double) ((Phi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_psi] = frand((double) ((Psi[j] - binNum) * PI / binNum),
                                                    (double) ((Psi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_omega] = larbb_angles[j][eix_omega];
                            break;
                        }
                    }
                }
            }
        } // end select subset of backbone angles
    }